

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator.cpp
# Opt level: O0

bool __thiscall Calculator::execute(Calculator *this,string *line,bool printResult)

{
  int iVar1;
  double dVar2;
  ResultValue value;
  ResultValue value_00;
  ResultValueType RVar3;
  ulong uVar4;
  char *pcVar5;
  reference pvVar6;
  size_type sVar7;
  mapped_type *this_00;
  ostream *poVar8;
  void *this_01;
  int64_t iVar9;
  int64_t num;
  exception *e;
  allocator local_2f9;
  string local_2f8;
  undefined1 local_2d8 [16];
  int64_t local_2c8;
  double dStack_2c0;
  undefined8 local_2b8;
  complex<double> local_2b0;
  complex<double> local_2a0;
  allocator local_289;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  undefined1 local_208 [8];
  string baseSubscript;
  string local_1e0;
  string local_1c0;
  allocator local_199;
  string local_198;
  string local_178;
  undefined1 auStack_158 [8];
  ResultValue res;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  undefined4 local_ec;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c8;
  const_iterator local_c0;
  undefined1 local_b8 [8];
  string cmd;
  allocator local_81;
  string local_80;
  string local_60;
  undefined1 local_40 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  bool printResult_local;
  string *line_local;
  Calculator *this_local;
  
  parts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = printResult;
  uVar4 = std::__cxx11::string::size();
  if ((uVar4 < 2) ||
     (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)line), *pcVar5 != ':')) {
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      CalculationEngine::evaluate
                ((ResultValue *)auStack_158,&this->mEngine,line,&this->mEnvironment);
      RVar3 = ResultValue::type((ResultValue *)auStack_158);
      if ((RVar3 != NONE) &&
         ((parts.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0)) {
        RVar3 = ResultValue::type((ResultValue *)auStack_158);
        if (RVar3 == INTEGER) {
          iVar1 = this->mPrintNumBase;
          if (iVar1 == 2) {
            poVar8 = this->mOutputStream;
            iVar9 = ResultValue::intValue((ResultValue *)auStack_158);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_198,"0b",&local_199);
            NumberHelpers::toBase(&local_178,iVar9,2,&local_198);
            poVar8 = std::operator<<(poVar8,(string *)&local_178);
            std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
            std::__cxx11::string::~string((string *)&local_178);
            std::__cxx11::string::~string((string *)&local_198);
            std::allocator<char>::~allocator((allocator<char> *)&local_199);
          }
          else if (iVar1 == 10) {
            poVar8 = this->mOutputStream;
            iVar9 = ResultValue::intValue((ResultValue *)auStack_158);
            this_01 = (void *)std::ostream::operator<<(poVar8,iVar9);
            std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
          }
          else if (iVar1 == 0x10) {
            poVar8 = this->mOutputStream;
            iVar9 = ResultValue::intValue((ResultValue *)auStack_158);
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_1e0,"0x",
                       (allocator *)(baseSubscript.field_2._M_local_buf + 0xf));
            NumberHelpers::toBase(&local_1c0,iVar9,0x10,&local_1e0);
            poVar8 = std::operator<<(poVar8,(string *)&local_1c0);
            std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
            std::__cxx11::string::~string((string *)&local_1c0);
            std::__cxx11::string::~string((string *)&local_1e0);
            std::allocator<char>::~allocator
                      ((allocator<char> *)(baseSubscript.field_2._M_local_buf + 0xf));
          }
          else {
            std::__cxx11::to_string(&local_228,this->mPrintNumBase);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_208,"_",&local_228);
            std::__cxx11::string::~string((string *)&local_228);
            (anonymous_namespace)::getSubscript_abi_cxx11_
                      (&local_248,(_anonymous_namespace_ *)(long)this->mPrintNumBase,num);
            std::__cxx11::string::operator=((string *)local_208,(string *)&local_248);
            std::__cxx11::string::~string((string *)&local_248);
            poVar8 = this->mOutputStream;
            iVar9 = ResultValue::intValue((ResultValue *)auStack_158);
            iVar1 = this->mPrintNumBase;
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_288,"",&local_289);
            NumberHelpers::toBase(&local_268,iVar9,iVar1,&local_288);
            poVar8 = std::operator<<(poVar8,(string *)&local_268);
            poVar8 = std::operator<<(poVar8,(string *)local_208);
            std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
            std::__cxx11::string::~string((string *)&local_268);
            std::__cxx11::string::~string((string *)&local_288);
            std::allocator<char>::~allocator((allocator<char> *)&local_289);
            local_ec = 2;
            std::__cxx11::string::~string((string *)local_208);
          }
        }
        else {
          RVar3 = ResultValue::type((ResultValue *)auStack_158);
          if ((RVar3 == COMPLEX) && ((this->mPrintInPolar & 1U) != 0)) {
            poVar8 = this->mOutputStream;
            ResultValue::complexValue((ResultValue *)auStack_158);
            dVar2 = std::abs<double>(&local_2a0);
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,dVar2);
            poVar8 = std::operator<<(poVar8," * e^(");
            ResultValue::complexValue((ResultValue *)auStack_158);
            dVar2 = std::arg<double>(&local_2b0);
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,dVar2);
            poVar8 = std::operator<<(poVar8,"i)");
            std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
          }
          else {
            local_2b8 = res.mComplexValue._M_value._0_8_;
            local_2c8 = res.mIntValue;
            dStack_2c0 = res.mFloatValue;
            local_2d8._0_8_ = auStack_158;
            local_2d8._8_8_ = res._0_8_;
            value.mIntValue = res._0_8_;
            value._0_8_ = auStack_158;
            value.mFloatValue = (double)res.mIntValue;
            value.mComplexValue._M_value._0_8_ = res.mFloatValue;
            value.mComplexValue._M_value._8_8_ = res.mComplexValue._M_value._0_8_;
            poVar8 = operator<<(this->mOutputStream,value);
            std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
          }
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_2f8,"ans",&local_2f9);
        value_00.mIntValue = res._0_8_;
        value_00._0_8_ = auStack_158;
        value_00.mFloatValue = (double)res.mIntValue;
        value_00.mComplexValue._M_value._0_8_ = res.mFloatValue;
        value_00.mComplexValue._M_value._8_8_ = res.mComplexValue._M_value._0_8_;
        Environment::set(&this->mEnvironment,&local_2f8,value_00);
        std::__cxx11::string::~string((string *)&local_2f8);
        std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
      }
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    std::__cxx11::string::substr((ulong)&local_60,(ulong)line);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_80," ",&local_81);
    anon_unknown.dwarf_29805::splitString
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_40,&local_60,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    std::__cxx11::string::~string((string *)&local_60);
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_40,0);
    std::__cxx11::string::string((string *)local_b8,(string *)pvVar6);
    sVar7 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>_>_>_>
            ::count(&this->mCommands,(key_type *)local_b8);
    if (sVar7 == 0) {
      poVar8 = this->mOutputStream;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (res.mComplexValue._M_value + 8),"There exists no command called \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
      std::operator+(&local_110,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (res.mComplexValue._M_value + 8),"\'. Type \':help\' for a list of commands.");
      poVar8 = std::operator<<(poVar8,(string *)&local_110);
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)(res.mComplexValue._M_value + 8));
      this_local._7_1_ = false;
    }
    else {
      local_c8._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_40);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_c0,&local_c8);
      local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_40,local_c0);
      this_00 = std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>_>_>_>
                ::operator[](&this->mCommands,(key_type *)local_b8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_e8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_40);
      this_local._7_1_ =
           std::
           function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
           ::operator()(this_00,&local_e8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_e8);
    }
    local_ec = 1;
    std::__cxx11::string::~string((string *)local_b8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_40);
  }
  return this_local._7_1_;
}

Assistant:

bool Calculator::execute(const std::string& line, bool printResult) {
	if (line.size() > 1 && line[0] == ':') {
		auto parts = splitString(line.substr(1), " ");
		std::string cmd = parts[0];

		if (mCommands.count(cmd) > 0) {
			parts.erase(parts.begin());
			return mCommands[cmd](parts);
		} else {
			mOutputStream << "There exists no command called '" + cmd + "'. Type ':help' for a list of commands." << std::endl;
		}

		return false;
	}

	if (line.empty()) {
		return false;
	}

	try {
		auto res = mEngine.evaluate(line, mEnvironment);

		if (res.type() != ResultValueType::NONE) {
			if (printResult) {
				if (res.type() == ResultValueType::INTEGER) {
					switch (mPrintNumBase) {
						case 2:
							mOutputStream << NumberHelpers::toBase(res.intValue(), 2, "0b") << std::endl;
							break;
						case 10:
							mOutputStream << res.intValue() << std::endl;
							break;
						case 16:
							mOutputStream << NumberHelpers::toBase(res.intValue(), 16, "0x") << std::endl;
							break;
						default:
							std::string baseSubscript = "_" + std::to_string(mPrintNumBase);

							#ifdef __unix__
							baseSubscript = getSubscript(mPrintNumBase);
							#endif

							mOutputStream << NumberHelpers::toBase(res.intValue(), mPrintNumBase) << baseSubscript << std::endl;
							break;
					}
				} else if (res.type() == ResultValueType::COMPLEX && mPrintInPolar) {
					mOutputStream << std::abs(res.complexValue()) << " * e^(" << std::arg(res.complexValue()) << "i)" << std::endl;
				} else {
					mOutputStream << res << std::endl;
				}

				mEnvironment.set("ans", res);
			}
		}
	} catch (std::exception& e) {
		mOutputStream << "Error: " << e.what() << std::endl;
	}

	return false;
}